

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_AddClientCA_Test::TestBody(SSLTest_AddClientCA_Test *this)

{
  int iVar1;
  SSL_METHOD *meth;
  X509_NAME *b;
  X509_NAME *pXVar2;
  OPENSSL_STACK *pOVar3;
  X509_NAME *pXVar4;
  pointer *__ptr;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar5;
  char *in_R9;
  AssertHelper local_78;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  UniquePtr<X509> cert1;
  UniquePtr<SSL> ssl;
  UniquePtr<X509> cert2;
  UniquePtr<SSL_CTX> ctx;
  
  meth = (SSL_METHOD *)TLS_method();
  ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&ssl);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x2f5309,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cert1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6e2,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&cert1,(Message *)&ssl);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cert1);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
        ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    goto LAB_001594bf;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_ssl_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
                 SSL_new((SSL_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  this_00 = &gtest_ar_.message_;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ssl_st_*,_bssl::internal::Deleter>)
       ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl != (_Head_base<0UL,_ssl_st_*,_false>)0x0;
  if ((tuple<ssl_st_*,_bssl::internal::Deleter>)
      ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl == (_Head_base<0UL,_ssl_st_*,_false>)0x0)
  {
    testing::Message::Message((Message *)&cert1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)0x301297,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cert2,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6e4,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=((AssertHelper *)&cert2,(Message *)&cert1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cert2);
    std::__cxx11::string::~string((string *)&gtest_ar);
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      (**(code **)(*(long *)cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
                            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_x509_st_*,_false>._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    GetTestCertificate();
    GetChainTestCertificate();
    if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
        cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) {
      gtest_ar_._0_8_ = (ulong)(uint7)gtest_ar_._1_7_ << 8;
LAB_00158ef2:
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      testing::Message::Message((Message *)&local_78);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"cert1 && cert2",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x6e8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      std::__cxx11::string::~string((string *)&gtest_ar);
      if ((long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 8))();
      }
    }
    else {
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ =
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
           cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_x509_st_*,_false>._M_head_impl !=
           (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0;
      if ((__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)
          cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_x509_st_*,_false>._M_head_impl ==
          (__uniq_ptr_impl<x509_st,_bssl::internal::Deleter>)0x0) goto LAB_00158ef2;
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(this_00);
      b = X509_get_subject_name
                    ((X509 *)cert1._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                             .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
      pXVar2 = X509_get_subject_name
                         ((X509 *)cert2._M_t.super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>
                                  ._M_t.super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
      local_78.data_._0_4_ = 0;
      pOVar3 = (OPENSSL_STACK *)
               SSL_get_client_CA_list
                         ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                 _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
      gtest_ar_._0_8_ = OPENSSL_sk_num(pOVar3);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                ((internal *)&gtest_ar,"0u","sk_X509_NAME_num(SSL_get_client_CA_list(ssl.get()))",
                 (uint *)&local_78,(unsigned_long *)&gtest_ar_);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_78,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6ec,pcVar5);
        testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
        testing::internal::AssertHelper::~AssertHelper(&local_78);
        if (gtest_ar_._0_8_ != 0) {
          (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      iVar1 = SSL_add_client_CA((SSL *)ssl._M_t.
                                       super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                       super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                       super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                (X509 *)cert1._M_t.
                                        super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>._M_t
                                        .super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>.
                                        super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar1 != 0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_78);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert1.get())","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6ee,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
LAB_00159410:
        this_00 = &gtest_ar_.message_;
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        std::__cxx11::string::~string((string *)&gtest_ar);
        if ((long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_78.data_._4_4_,(int)local_78.data_) + 8))();
        }
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar1 = SSL_add_client_CA((SSL *)ssl._M_t.
                                         super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t
                                         .super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                         super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                  (X509 *)cert2._M_t.
                                          super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                          _M_t.
                                          super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar1 != 0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_78);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert2.get())","false","true",
                     in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6ef,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
          goto LAB_00159410;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        pOVar3 = (OPENSSL_STACK *)
                 SSL_get_client_CA_list
                           ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                   _M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                   super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
        local_78.data_._0_4_ = 2;
        gtest_ar_._0_8_ = OPENSSL_sk_num(pOVar3);
        testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                  ((internal *)&gtest_ar,"2u","sk_X509_NAME_num(list)",(uint *)&local_78,
                   (unsigned_long *)&gtest_ar_);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = *(char **)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6f2,pcVar5);
          testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
LAB_0015947c:
          this_00 = &gtest_ar.message_;
          testing::internal::AssertHelper::~AssertHelper(&local_78);
          if (gtest_ar_._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
          }
        }
        else {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
          pXVar4 = (X509_NAME *)OPENSSL_sk_value(pOVar3,0);
          local_78.data_._0_4_ = X509_NAME_cmp(pXVar4,b);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1)",
                     (int *)&gtest_ar_,(int *)&local_78);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6f3,pcVar5);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
          pXVar4 = (X509_NAME *)OPENSSL_sk_value(pOVar3,1);
          local_78.data_._0_4_ = X509_NAME_cmp(pXVar4,pXVar2);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2)",
                     (int *)&gtest_ar_,(int *)&local_78);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6f4,pcVar5);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          iVar1 = SSL_add_client_CA((SSL *)ssl._M_t.
                                           super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>.
                                           _M_t.
                                           super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                           .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                                    (X509 *)cert1._M_t.
                                            super___uniq_ptr_impl<x509_st,_bssl::internal::Deleter>.
                                            _M_t.
                                            super__Tuple_impl<0UL,_x509_st_*,_bssl::internal::Deleter>
                                            .super__Head_base<0UL,_x509_st_*,_false>._M_head_impl);
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar_.success_ = iVar1 != 0;
          if (iVar1 == 0) {
            testing::Message::Message((Message *)&local_78);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)"SSL_add_client_CA(ssl.get(), cert1.get())","false","true"
                       ,in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_40,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6f6,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
            testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_78);
            goto LAB_00159410;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          pOVar3 = (OPENSSL_STACK *)
                   SSL_get_client_CA_list
                             ((SSL *)ssl._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                                     ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>
                                     .super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
          local_78.data_._0_4_ = 3;
          gtest_ar_._0_8_ = OPENSSL_sk_num(pOVar3);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)&gtest_ar,"3u","sk_X509_NAME_num(list)",(uint *)&local_78,
                     (unsigned_long *)&gtest_ar_);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6f9,pcVar5);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
            goto LAB_0015947c;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
          pXVar4 = (X509_NAME *)OPENSSL_sk_value(pOVar3,0);
          local_78.data_._0_4_ = X509_NAME_cmp(pXVar4,b);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1)",
                     (int *)&gtest_ar_,(int *)&local_78);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6fa,pcVar5);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
          pXVar4 = (X509_NAME *)OPENSSL_sk_value(pOVar3,1);
          local_78.data_._0_4_ = X509_NAME_cmp(pXVar4,pXVar2);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2)",
                     (int *)&gtest_ar_,(int *)&local_78);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6fb,pcVar5);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar.message_);
          gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
          pXVar2 = (X509_NAME *)OPENSSL_sk_value(pOVar3,2);
          local_78.data_._0_4_ = X509_NAME_cmp(pXVar2,b);
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&gtest_ar,"0","X509_NAME_cmp(sk_X509_NAME_value(list, 2), name1)",
                     (int *)&gtest_ar_,(int *)&local_78);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&gtest_ar_);
            if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl ==
                (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = *(char **)gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_78,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6fc,pcVar5);
            testing::internal::AssertHelper::operator=(&local_78,(Message *)&gtest_ar_);
            testing::internal::AssertHelper::~AssertHelper(&local_78);
            if (gtest_ar_._0_8_ != 0) {
              (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
            }
          }
          this_00 = &gtest_ar.message_;
        }
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(this_00);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert2);
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr(&cert1);
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&ssl);
LAB_001594bf:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return;
}

Assistant:

TEST(SSLTest, AddClientCA) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  ASSERT_TRUE(ssl);

  bssl::UniquePtr<X509> cert1 = GetTestCertificate();
  bssl::UniquePtr<X509> cert2 = GetChainTestCertificate();
  ASSERT_TRUE(cert1 && cert2);
  X509_NAME *name1 = X509_get_subject_name(cert1.get());
  X509_NAME *name2 = X509_get_subject_name(cert2.get());

  EXPECT_EQ(0u, sk_X509_NAME_num(SSL_get_client_CA_list(ssl.get())));

  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert1.get()));
  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert2.get()));

  STACK_OF(X509_NAME) *list = SSL_get_client_CA_list(ssl.get());
  ASSERT_EQ(2u, sk_X509_NAME_num(list));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2));

  ASSERT_TRUE(SSL_add_client_CA(ssl.get(), cert1.get()));

  list = SSL_get_client_CA_list(ssl.get());
  ASSERT_EQ(3u, sk_X509_NAME_num(list));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 0), name1));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 1), name2));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(list, 2), name1));
}